

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_image.h
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> *
bmp_image::read_pixel_data
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          istream *input,uint32_t offset,int32_t height,uint32_t stride)

{
  allocator_type local_21;
  
  std::istream::seekg(input,offset,0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,(ulong)stride * (long)height,&local_21);
  std::istream::read((char *)input,
                     (long)(__return_storage_ptr__->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start);
  return __return_storage_ptr__;
}

Assistant:

static std::vector<uint8_t> read_pixel_data(std::istream& input, const uint32_t offset, const int32_t height,
                                                const uint32_t stride)
    {
        input.seekg(offset);

        std::vector<uint8_t> pixel_data(static_cast<size_t>(height) * stride);
        input.read(reinterpret_cast<char*>(pixel_data.data()), static_cast<std::streamsize>(pixel_data.size()));

        return pixel_data;
    }